

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

void __thiscall QMessagePattern::QMessagePattern(QMessagePattern *this)

{
  rep rVar1;
  char **ppcVar2;
  pointer *__ptr;
  long in_FS_OFFSET;
  bool bVar3;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->timeArgs).d.d = (Data *)0x0;
  (this->timeArgs).d.ptr = (QString *)0x0;
  (this->literals)._M_t.
  super___uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
  .super__Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
  ._M_head_impl = (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0;
  (this->tokens)._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
  .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char **)0x0;
  (this->timeArgs).d.size = 0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->appStartTime).__d.__r = rVar1;
  (this->backtraceArgs).d.d = (Data *)0x0;
  (this->backtraceArgs).d.ptr = (BacktraceParams *)0x0;
  *(undefined8 *)((long)&(this->backtraceArgs).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->backtraceArgs).d.size + 4) = 0;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable(&local_48,"QT_MESSAGE_PATTERN");
  bVar3 = (undefined1 *)local_48.d.size == (undefined1 *)0x0;
  if (bVar3) {
    ppcVar2 = (char **)operator_new__(0x30);
    *ppcVar2 = "%{if-category}";
    ppcVar2[1] = "%{category}";
    ppcVar2[2] = ": ";
    ppcVar2[3] = "%{endif}";
    ppcVar2[4] = "%{message}";
    ppcVar2[5] = (char *)0x0;
    (this->tokens)._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
    _M_t.super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
    super__Head_base<0UL,_const_char_**,_false>._M_head_impl = ppcVar2;
  }
  else {
    setPattern(this,&local_48);
  }
  this->fromEnvironment = !bVar3;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMessagePattern::QMessagePattern()
{
    const QString envPattern = qEnvironmentVariable("QT_MESSAGE_PATTERN");
    if (envPattern.isEmpty()) {
        setDefaultPattern();
        fromEnvironment = false;
    } else {
        setPattern(envPattern);
        fromEnvironment = true;
    }
}